

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer,op_queue<asio::detail::scheduler_operation> *ops,
              size_t max_cancelled)

{
  bool bVar1;
  wait_op *local_48;
  wait_op *op;
  size_t num_cancelled;
  size_t max_cancelled_local;
  op_queue<asio::detail::scheduler_operation> *ops_local;
  per_timer_data *timer_local;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *this_local;
  
  op = (wait_op *)0x0;
  if ((timer->prev_ != (per_timer_data *)0x0) || (timer == this->timers_)) {
    while( true ) {
      if (op == (wait_op *)max_cancelled) {
        local_48 = (wait_op *)0x0;
      }
      else {
        local_48 = op_queue<asio::detail::wait_op>::front(&timer->op_queue_);
      }
      if (local_48 == (wait_op *)0x0) break;
      std::error_code::operator=(&local_48->ec_,operation_aborted);
      op_queue<asio::detail::wait_op>::pop(&timer->op_queue_);
      op_queue<asio::detail::scheduler_operation>::push(ops,&local_48->super_operation);
      op = (wait_op *)((long)&(op->super_operation).next_ + 1);
    }
    bVar1 = op_queue<asio::detail::wait_op>::empty(&timer->op_queue_);
    if (bVar1) {
      remove_timer(this,timer);
    }
  }
  return (size_t)op;
}

Assistant:

std::size_t cancel_timer(per_timer_data& timer, op_queue<operation>& ops,
      std::size_t max_cancelled = (std::numeric_limits<std::size_t>::max)())
  {
    std::size_t num_cancelled = 0;
    if (timer.prev_ != 0 || &timer == timers_)
    {
      while (wait_op* op = (num_cancelled != max_cancelled)
          ? timer.op_queue_.front() : 0)
      {
        op->ec_ = asio::error::operation_aborted;
        timer.op_queue_.pop();
        ops.push(op);
        ++num_cancelled;
      }
      if (timer.op_queue_.empty())
        remove_timer(timer);
    }
    return num_cancelled;
  }